

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<int,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<int,_fmt::v6::basic_format_specs<char>_> *this)

{
  long *plVar1;
  char cVar2;
  locale *plVar3;
  num_writer f;
  char cVar4;
  int iVar5;
  int iVar6;
  numpunct *pnVar7;
  long *plVar8;
  uint uVar9;
  int iVar10;
  string_view prefix;
  string groups;
  locale local_58 [8];
  uint local_50;
  int iStack_4c;
  long **pplStack_48;
  char local_40;
  undefined7 uStack_3f;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_58);
  }
  else {
    std::locale::locale(local_58,plVar3);
  }
  pnVar7 = std::use_facet<std::__cxx11::numpunct<char>>(local_58);
  (**(code **)(*(long *)pnVar7 + 0x20))(&local_38,pnVar7);
  std::locale::~locale(local_58);
  if (local_30 == 0) {
    on_dec(this);
    goto LAB_001373c8;
  }
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_58);
  }
  else {
    std::locale::locale(local_58,plVar3);
  }
  pnVar7 = std::use_facet<std::__cxx11::numpunct<char>>(local_58);
  cVar4 = (**(code **)(*(long *)pnVar7 + 0x18))(pnVar7);
  std::locale::~locale(local_58);
  if (cVar4 == '\0') {
    on_dec(this);
    goto LAB_001373c8;
  }
  local_50 = this->abs_value;
  uVar9 = 0x1f;
  if ((local_50 | 1) != 0) {
    for (; (local_50 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  iVar10 = (uVar9 + 1) -
           (uint)(local_50 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar9 * 4)
                 );
  plVar1 = (long *)((long)local_38 + local_30);
  plVar8 = local_38;
  iVar5 = iVar10;
  if (local_30 == 0) {
LAB_00137370:
    iStack_4c = iVar10;
    iVar6 = iVar5;
    if (plVar8 == plVar1) goto LAB_0013737a;
  }
  else {
    iStack_4c = iVar10 + (int)local_30;
    do {
      cVar2 = (char)*plVar8;
      iVar6 = iVar5 - cVar2;
      if ((iVar6 == 0 || iVar5 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_00137370;
      iVar10 = iVar10 + 1;
      plVar8 = (long *)((long)plVar8 + 1);
      local_30 = local_30 + -1;
      iVar5 = iVar6;
    } while (local_30 != 0);
LAB_0013737a:
    iStack_4c = (iVar6 + -1) / (int)*(char *)((long)plVar1 + -1) + iStack_4c;
  }
  f._17_7_ = uStack_3f;
  f.sep = cVar4;
  f.size = iStack_4c;
  f.abs_value = local_50;
  f.groups = (string *)&local_38;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  pplStack_48 = &local_38;
  local_40 = cVar4;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<int,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,iStack_4c,prefix,*this->specs
             ,f);
LAB_001373c8:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }